

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

bool doctest::anon_unknown_14::parseFlag(int argc,char **argv,char *pattern)

{
  bool bVar1;
  anon_union_24_2_13149d16_for_String_2 local_20;
  
  local_20.buf[0] = '\0';
  local_20.buf[0x17] = '\x17';
  bVar1 = parseOption(argc,argv,pattern,(String *)0x0,(String *)&local_20.data);
  String::~String((String *)&local_20.data);
  return bVar1;
}

Assistant:

bool parseFlag(int argc, const char* const* argv, const char* pattern) {
        return parseOption(argc, argv, pattern);
    }